

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::FuncPass::run(FuncPass *this,Zone *zone,Logger *logger)

{
  Error EVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = *(long *)&((this->super_Pass)._cb)->_nodeList;
  if (lVar2 == 0) {
    return 0;
  }
  bVar3 = *(char *)(lVar2 + 0x10) == '\x10';
  do {
    if (bVar3) {
      lVar2 = *(long *)(lVar2 + 0x340);
      EVar1 = (*(this->super_Pass)._vptr_Pass[3])(this,zone,logger);
      if (EVar1 != 0) {
        return EVar1;
      }
    }
    do {
      lVar2 = *(long *)(lVar2 + 8);
      if (lVar2 == 0) {
        return 0;
      }
    } while (*(char *)(lVar2 + 0x10) != '\x10');
    bVar3 = true;
  } while( true );
}

Assistant:

Error FuncPass::run(Zone* zone, Logger* logger) {
  BaseNode* node = cb()->firstNode();
  if (!node) return kErrorOk;

  do {
    if (node->type() == NodeType::kFunc) {
      FuncNode* func = node->as<FuncNode>();
      node = func->endNode();
      ASMJIT_PROPAGATE(runOnFunction(zone, logger, func));
    }

    // Find a function by skipping all nodes that are not `NodeType::kFunc`.
    do {
      node = node->next();
    } while (node && node->type() != NodeType::kFunc);
  } while (node);

  return kErrorOk;
}